

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u32.cpp
# Opt level: O3

void T_UConverter_fromUnicode_UTF32_BE(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  uchar uVar1;
  char cVar2;
  UChar *pUVar3;
  uchar *targetLimit;
  uchar *puVar4;
  uint uVar5;
  long lVar6;
  UConverter *pUVar7;
  UChar *pUVar8;
  uchar temp [4];
  
  pUVar8 = args->source;
  pUVar3 = args->sourceLimit;
  if (pUVar8 < pUVar3) {
    targetLimit = (uchar *)args->targetLimit;
    pUVar7 = args->converter;
    if (pUVar7->fromUnicodeStatus == 1) {
      ucnv_fromUWriteBytes_63(pUVar7,"",4,&args->target,(char *)targetLimit,&args->offsets,-1,err);
      pUVar7 = args->converter;
      pUVar7->fromUnicodeStatus = 0;
    }
    puVar4 = (uchar *)args->target;
    temp[0] = '\0';
    uVar5 = pUVar7->fromUChar32;
    if (uVar5 == 0) goto LAB_0033ad11;
    pUVar7->fromUChar32 = 0;
    do {
      if (pUVar3 <= pUVar8) {
        args->converter->fromUChar32 = uVar5;
        if (args->flush == '\0') goto LAB_0033ade2;
        goto LAB_0033addb;
      }
      if (((ushort)*pUVar8 & 0xfc00) != 0xdc00) break;
      uVar5 = uVar5 * 0x400 + (uint)(ushort)*pUVar8 + 0xfca02400;
      pUVar8 = pUVar8 + 1;
      do {
        temp[1] = (byte)(uVar5 >> 0x10) & 0x1f;
        temp[2] = (uchar)(uVar5 >> 8);
        temp[3] = (uchar)uVar5;
        lVar6 = 0;
        do {
          uVar1 = temp[lVar6];
          if (puVar4 < targetLimit) {
            *puVar4 = uVar1;
            puVar4 = puVar4 + 1;
          }
          else {
            pUVar7 = args->converter;
            cVar2 = pUVar7->charErrorBufferLength;
            pUVar7->charErrorBufferLength = cVar2 + '\x01';
            pUVar7->charErrorBuffer[cVar2] = uVar1;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
LAB_0033ad11:
        if ((pUVar3 <= pUVar8) || (targetLimit <= puVar4)) goto LAB_0033ade2;
        uVar5 = (uint)(ushort)*pUVar8;
        pUVar8 = pUVar8 + 1;
      } while ((uVar5 & 0xf800) != 0xd800);
    } while ((uVar5 & 0xdc00) == 0xd800);
    args->converter->fromUChar32 = uVar5;
LAB_0033addb:
    *err = U_ILLEGAL_CHAR_FOUND;
LAB_0033ade2:
    if (((pUVar8 < pUVar3) && (targetLimit <= puVar4)) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
      *err = U_BUFFER_OVERFLOW_ERROR;
    }
    args->target = (char *)puVar4;
    args->source = pUVar8;
  }
  return;
}

Assistant:

static void U_CALLCONV
T_UConverter_fromUnicode_UTF32_BE(UConverterFromUnicodeArgs * args,
                                  UErrorCode * err)
{
    const UChar *mySource = args->source;
    unsigned char *myTarget;
    const UChar *sourceLimit = args->sourceLimit;
    const unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    UChar32 ch, ch2;
    unsigned int indexToWrite;
    unsigned char temp[sizeof(uint32_t)];

    if(mySource >= sourceLimit) {
        /* no input, nothing to do */
        return;
    }

    /* write the BOM if necessary */
    if(args->converter->fromUnicodeStatus==UCNV_NEED_TO_WRITE_BOM) {
        static const char bom[]={ 0, 0, (char)0xfeu, (char)0xffu };
        ucnv_fromUWriteBytes(args->converter,
                             bom, 4,
                             &args->target, args->targetLimit,
                             &args->offsets, -1,
                             err);
        args->converter->fromUnicodeStatus=0;
    }

    myTarget = (unsigned char *) args->target;
    temp[0] = 0;

    if (args->converter->fromUChar32) {
        ch = args->converter->fromUChar32;
        args->converter->fromUChar32 = 0;
        goto lowsurogate;
    }

    while (mySource < sourceLimit && myTarget < targetLimit) {
        ch = *(mySource++);

        if (U_IS_SURROGATE(ch)) {
            if (U_IS_LEAD(ch)) {
lowsurogate:
                if (mySource < sourceLimit) {
                    ch2 = *mySource;
                    if (U_IS_TRAIL(ch2)) {
                        ch = ((ch - SURROGATE_HIGH_START) << HALF_SHIFT) + ch2 + SURROGATE_LOW_BASE;
                        mySource++;
                    }
                    else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        args->converter->fromUChar32 = ch;
                        *err = U_ILLEGAL_CHAR_FOUND;
                        break;
                    }
                }
                else {
                    /* ran out of source */
                    args->converter->fromUChar32 = ch;
                    if (args->flush) {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err = U_ILLEGAL_CHAR_FOUND;
                    }
                    break;
                }
            }
            else {
                /* this is an unmatched trail code unit (2nd surrogate) */
                /* callback(illegal) */
                args->converter->fromUChar32 = ch;
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }

        /* We cannot get any larger than 10FFFF because we are coming from UTF-16 */
        temp[1] = (uint8_t) (ch >> 16 & 0x1F);
        temp[2] = (uint8_t) (ch >> 8);  /* unsigned cast implicitly does (ch & FF) */
        temp[3] = (uint8_t) (ch);       /* unsigned cast implicitly does (ch & FF) */

        for (indexToWrite = 0; indexToWrite <= sizeof(uint32_t) - 1; indexToWrite++) {
            if (myTarget < targetLimit) {
                *(myTarget++) = temp[indexToWrite];
            }
            else {
                args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = temp[indexToWrite];
                *err = U_BUFFER_OVERFLOW_ERROR;
            }
        }
    }

    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err)) {
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = (char *) myTarget;
    args->source = mySource;
}